

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall nonius::detail::option::long_separator(option *this,string *s)

{
  long lVar1;
  pointer pcVar2;
  long *in_RDX;
  long lVar3;
  long extraout_RDX;
  _Alloc_hider _Var4;
  long lVar5;
  bool bVar6;
  tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"--",s);
  pcVar2 = (pointer)*in_RDX;
  lVar3 = in_RDX[1];
  _Var4._M_p = local_38._M_dataplus._M_p;
  if (local_38._M_string_length != 0 && lVar3 != 0) {
    lVar3 = lVar3 + -1;
    lVar5 = 0;
    do {
      if (pcVar2[lVar5] != local_38._M_dataplus._M_p[lVar5]) {
        pcVar2 = pcVar2 + lVar5;
        _Var4._M_p = local_38._M_dataplus._M_p + lVar5;
        goto LAB_0014f767;
      }
      lVar1 = lVar5 + 1;
    } while ((lVar3 != lVar5) &&
            (bVar6 = local_38._M_string_length - 1 != lVar5, lVar5 = lVar1, bVar6));
    pcVar2 = pcVar2 + lVar1;
    _Var4._M_p = local_38._M_dataplus._M_p + lVar1;
  }
LAB_0014f767:
  (this->long_form)._M_dataplus._M_p = pcVar2;
  *(bool *)&(this->long_form)._M_string_length =
       _Var4._M_p == local_38._M_dataplus._M_p + local_38._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    lVar3 = extraout_RDX;
  }
  tVar7.
  super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._8_8_ = lVar3;
  tVar7.
  super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )this;
  return (tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )tVar7.
           super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
}

Assistant:

std::tuple<bool, std::string::const_iterator> long_separator(std::string const& s) const {
                auto l = "--" + long_form;
                auto its = detail::mismatch(s.begin(), s.end(), l.begin(), l.end(), [](char a, char b) { return a == b; });
                return std::make_tuple(its.second == l.end(), its.first);
            }